

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_value_numbering.cpp
# Opt level: O2

string * __thiscall
mocker::LocalValueNumbering::hash_abi_cxx11_
          (string *__return_storage_ptr__,LocalValueNumbering *this,
          shared_ptr<mocker::ir::IRInst> *inst,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *valueNumbers)

{
  OpType OVar1;
  unsigned_long *puVar2;
  ulong *puVar3;
  uint __line;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  unsigned_long *puVar10;
  LocalValueNumbering *this_00;
  char *__str;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer __lhs;
  shared_ptr<mocker::ir::ArithUnaryInst> p_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vnStr;
  OpType op;
  undefined4 uStack_304;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  shared_ptr<mocker::ir::RelationInst> p_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  shared_ptr<mocker::ir::ArithBinaryInst> p_2;
  undefined1 local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [32];
  shared_ptr<mocker::ir::Assign> p;
  undefined1 auStack_1c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  OpType local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined4 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined4 local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined4 local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined4 local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined4 local_e8;
  element_type *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  undefined1 local_d0 [48];
  element_type *peStack_a0;
  undefined4 local_98;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  element_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  vnStr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vnStr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vnStr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&vnStr,(long)(valueNumbers->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(valueNumbers->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
  puVar2 = (valueNumbers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (puVar10 = (valueNumbers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2; puVar10 = puVar10 + 1)
  {
    std::__cxx11::to_string((string *)&p,*puVar10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vnStr,
               (string *)&p);
    std::__cxx11::string::~string((string *)&p);
  }
  this_00 = (LocalValueNumbering *)inst;
  ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
  if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    hash_abi_cxx11_(__return_storage_ptr__,this_00,
                    &(p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     operand);
    this_01 = &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    goto LAB_001610e0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p_1,inst);
  if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p_2,inst);
    if (p_2.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
          ::names_abi_cxx11_ == '\0') {
        iVar6 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                     ::names_abi_cxx11_);
        if (iVar6 != 0) {
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,"|"
                       ,1);
          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1c0;
          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((ulong)p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
               0xffffffff00000000);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == &local_338) {
            local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_;
          }
          else {
            p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
          }
          auStack_1c0._1_7_ = local_338._M_allocated_capacity._1_7_;
          auStack_1c0[0] = local_338._M_local_buf[0];
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_338._M_local_buf[0] = '\0';
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_338;
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,"&",
                       1);
          local_1a8 = &local_198;
          local_1b0 = BitNot;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_op == &local_2f8) {
            local_198._8_8_ = local_2f8._8_8_;
          }
          else {
            local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_op;
          }
          local_1a0._M_pi = local_300;
          local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2f8._M_local_buf[0] = '\0';
          _op = (pointer)&local_2f8;
          s_abi_cxx11_(&local_288,"^",1);
          local_180 = &local_170;
          local_188 = 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p == &local_288.field_2) {
            local_170._8_8_ = local_288.field_2._8_8_;
          }
          else {
            local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_288._M_dataplus._M_p;
          }
          local_178 = local_288._M_string_length;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          s_abi_cxx11_(&local_2a8,"<<",2);
          local_158 = &local_148;
          local_160 = 3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p == &local_2a8.field_2) {
            local_148._8_8_ = local_2a8.field_2._8_8_;
          }
          else {
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2a8._M_dataplus._M_p;
          }
          local_150 = local_2a8._M_string_length;
          local_2a8._M_string_length = 0;
          local_2a8.field_2._M_local_buf[0] = '\0';
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          s_abi_cxx11_(&local_2c8,">>",2);
          local_130 = &local_120;
          local_138 = 4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p == &local_2c8.field_2) {
            local_120._8_8_ = local_2c8.field_2._8_8_;
          }
          else {
            local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p;
          }
          local_128 = local_2c8._M_string_length;
          local_2c8._M_string_length = 0;
          local_2c8.field_2._M_local_buf[0] = '\0';
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          s_abi_cxx11_(&local_2e8,"+",1);
          local_108 = &local_f8;
          local_110 = 5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p == &local_2e8.field_2) {
            local_f8._8_8_ = local_2e8.field_2._8_8_;
          }
          else {
            local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2e8._M_dataplus._M_p;
          }
          local_100 = local_2e8._M_string_length;
          local_2e8._M_string_length = 0;
          local_2e8.field_2._M_local_buf[0] = '\0';
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_3,"-"
                       ,1);
          local_e0 = (element_type *)local_d0;
          local_e8 = 6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == &local_258) {
            local_d0._8_8_ = local_258._8_8_;
          }
          else {
            local_e0 = p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
          }
          local_d8 = p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_258._M_local_buf[0] = '\0';
          p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_258;
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,"*",1);
          local_d0._24_8_ = local_d0 + 0x28;
          local_d0._16_4_ = 7;
          if ((element_type *)local_238._0_8_ == (element_type *)(local_238 + 0x10)) {
            peStack_a0 = (element_type *)local_238._24_8_;
          }
          else {
            local_d0._24_8_ = local_238._0_8_;
          }
          local_d0._32_8_ = local_238._8_8_;
          local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_238[0x10] = '\0';
          local_238._0_8_ = (element_type *)(local_238 + 0x10);
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,"/",1);
          local_90 = &local_80;
          local_98 = 8;
          if ((element_type *)local_1f8._0_8_ == (element_type *)(local_1f8 + 0x10)) {
            local_80.identifier._M_dataplus._M_p = (pointer)local_1f8._24_8_;
          }
          else {
            local_90 = (element_type *)local_1f8._0_8_;
          }
          local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_;
          local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1f8[0x10] = '\0';
          local_1f8._0_8_ = (element_type *)(local_1f8 + 0x10);
          s_abi_cxx11_(&local_218,"%",1);
          local_80.identifier.field_2._M_allocated_capacity = (size_type)&local_58;
          local_80.identifier._M_string_length._0_4_ = 9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p == &local_218.field_2) {
            local_58._8_8_ = local_218.field_2._8_8_;
          }
          else {
            local_80.identifier.field_2._M_allocated_capacity =
                 (size_type)local_218._M_dataplus._M_p;
          }
          local_80.identifier.field_2._8_8_ = local_218._M_string_length;
          local_218._M_string_length = 0;
          local_218.field_2._M_local_buf[0] = '\0';
          local_40._M_len = 10;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          local_40._M_array = (iterator)&p;
          SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                      ::names_abi_cxx11_,&local_40);
          lVar9 = 0x170;
          do {
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + lVar9));
            lVar9 = lVar9 + -0x28;
          } while (lVar9 != -0x20);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)local_1f8);
          std::__cxx11::string::~string((string *)local_238);
          std::__cxx11::string::~string((string *)&p_3);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&op);
          std::__cxx11::string::~string((string *)&p_1);
          __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::~SmallMap,
                       &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                        ::names_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                               ::names_abi_cxx11_);
        }
      }
      if (hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
          ::associative == '\0') {
        iVar6 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                     ::associative);
        if (iVar6 != 0) {
          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
          auStack_1c0 = (undefined1  [8])0x5;
          local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&p;
          SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::SmallMap
                    (&hash::associative,
                     (initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_> *)&p_1)
          ;
          __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::~SmallMap,
                       &hash::associative,&__dso_handle);
          __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                               ::associative);
        }
      }
      if ((long)vnStr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vnStr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        __line = 0x6a;
LAB_00161280:
        __assert_fail("vnStr.size() == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                      ,__line,
                      "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                     );
      }
      p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,(p_2.
                           super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->op);
      bVar5 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::in
                        (&hash::associative,(OpType *)&p);
      if ((bVar5) &&
         (puVar3 = (valueNumbers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_start, puVar3[1] < *puVar3)) {
        std::__cxx11::string::swap
                  ((string *)
                   vnStr.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      op = (p_2.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->op;
      pbVar8 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                     ::names_abi_cxx11_,&op);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&vnStr,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                     pbVar8,pvVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,",");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&vnStr,1);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,pvVar7)
      ;
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::~string((string *)&p_1);
      this_01 = &p_2.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      goto LAB_001610e0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_2.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p_3,inst);
    if (p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
          ::names_abi_cxx11_ == '\0') {
        iVar6 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                     ::names_abi_cxx11_);
        if (iVar6 != 0) {
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                       "==",2);
          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1c0;
          p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((ulong)p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
               0xffffffff00000000);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == &local_338) {
            local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_;
          }
          else {
            p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
          }
          auStack_1c0._1_7_ = local_338._M_allocated_capacity._1_7_;
          auStack_1c0[0] = local_338._M_local_buf[0];
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_338._M_local_buf[0] = '\0';
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_338;
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,"!="
                       ,2);
          local_1a8 = &local_198;
          local_1b0 = BitNot;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_op == &local_2f8) {
            local_198._8_8_ = local_2f8._8_8_;
          }
          else {
            local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_op;
          }
          local_1a0._M_pi = local_300;
          local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2f8._M_local_buf[0] = '\0';
          _op = (pointer)&local_2f8;
          s_abi_cxx11_(&local_288,"<",1);
          local_180 = &local_170;
          local_188 = 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p == &local_288.field_2) {
            local_170._8_8_ = local_288.field_2._8_8_;
          }
          else {
            local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_288._M_dataplus._M_p;
          }
          local_178 = local_288._M_string_length;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          s_abi_cxx11_(&local_2a8,">",1);
          local_158 = &local_148;
          local_160 = 3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p == &local_2a8.field_2) {
            local_148._8_8_ = local_2a8.field_2._8_8_;
          }
          else {
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2a8._M_dataplus._M_p;
          }
          local_150 = local_2a8._M_string_length;
          local_2a8._M_string_length = 0;
          local_2a8.field_2._M_local_buf[0] = '\0';
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          s_abi_cxx11_(&local_2c8,"<=",2);
          local_130 = &local_120;
          local_138 = 4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p == &local_2c8.field_2) {
            local_120._8_8_ = local_2c8.field_2._8_8_;
          }
          else {
            local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p;
          }
          local_128 = local_2c8._M_string_length;
          local_2c8._M_string_length = 0;
          local_2c8.field_2._M_local_buf[0] = '\0';
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          s_abi_cxx11_(&local_2e8,">=",2);
          local_108 = &local_f8;
          local_110 = 5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p == &local_2e8.field_2) {
            local_f8._8_8_ = local_2e8.field_2._8_8_;
          }
          else {
            local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2e8._M_dataplus._M_p;
          }
          local_100 = local_2e8._M_string_length;
          local_2e8._M_string_length = 0;
          local_2e8.field_2._M_local_buf[0] = '\0';
          local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          local_238._0_8_ = (element_type *)&p;
          SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                      ::names_abi_cxx11_,
                     (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_238);
          lVar9 = 0xd0;
          do {
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + lVar9));
            lVar9 = lVar9 + -0x28;
          } while (lVar9 != -0x20);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&op);
          std::__cxx11::string::~string((string *)&p_1);
          __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::~SmallMap,
                       &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                        ::names_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                               ::names_abi_cxx11_);
        }
      }
      if ((long)vnStr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vnStr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        __line = 0x74;
        goto LAB_00161280;
      }
      OVar1 = (p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->op;
      op = OVar1;
      if (OVar1 == Ge) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                       "<=",vnStr.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,","
                      );
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       vnStr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      else if (OVar1 == Gt) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,"<"
                       ,vnStr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,","
                      );
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       vnStr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        if ((OVar1 < Lt) &&
           (puVar3 = (valueNumbers->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start, puVar3[1] < *puVar3)) {
          std::__cxx11::string::swap
                    ((string *)
                     vnStr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        pbVar8 = SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                       ::names_abi_cxx11_,&op);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                       pbVar8,vnStr.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,","
                      );
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       vnStr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::~string((string *)&p_1);
      this_01 = &p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      goto LAB_001610e0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p_1,inst);
    if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                    ,0x86,
                    "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                   );
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"phi,",(allocator<char> *)&p);
    pbVar4 = vnStr.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = vnStr.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar4; __lhs = __lhs + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,__lhs,
                     ",");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&p);
    }
  }
  else {
    __str = "~";
    if ((p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op
        == Neg) {
      __str = "-";
    }
    s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,__str,1);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&vnStr,0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,pvVar7);
    std::__cxx11::string::~string((string *)&p);
  }
  this_01 = &p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
LAB_001610e0:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vnStr);
  return __return_storage_ptr__;
}

Assistant:

std::string
LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &inst,
                          const std::vector<std::size_t> &valueNumbers) {
  using namespace std::string_literals;
  std::vector<std::string> vnStr;
  vnStr.reserve(valueNumbers.size());
  for (auto valueNumber : valueNumbers)
    vnStr.emplace_back(std::to_string(valueNumber));

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    return hash(p->getOperand());
  }
  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    return (p->getOp() == ir::ArithUnaryInst::Neg ? "-"s : "~"s) + vnStr.at(0);
  }
  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    static const SmallMap<ir::ArithBinaryInst::OpType, std::string> names{
        {ir::ArithBinaryInst::BitOr, "|"s}, {ir::ArithBinaryInst::BitAnd, "&"s},
        {ir::ArithBinaryInst::Xor, "^"s},   {ir::ArithBinaryInst::Shl, "<<"s},
        {ir::ArithBinaryInst::Shr, ">>"s},  {ir::ArithBinaryInst::Add, "+"s},
        {ir::ArithBinaryInst::Sub, "-"s},   {ir::ArithBinaryInst::Mul, "*"s},
        {ir::ArithBinaryInst::Div, "/"s},   {ir::ArithBinaryInst::Mod, "%"s}};
    static const SmallMap<ir::ArithBinaryInst::OpType, int> associative{
        {ir::ArithBinaryInst::BitOr, 0}, {ir::ArithBinaryInst::BitAnd, 0},
        {ir::ArithBinaryInst::Xor, 0},   {ir::ArithBinaryInst::Add, 0},
        {ir::ArithBinaryInst::Mul, 0},
    };
    assert(vnStr.size() == 2);
    if (associative.in(p->getOp()) && valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(p->getOp()) + vnStr.at(0) + "," + vnStr.at(1);
  }
  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    static const SmallMap<ir::RelationInst::OpType, std::string> names{
        {ir::RelationInst::Eq, "=="s}, {ir::RelationInst::Ne, "!="s},
        {ir::RelationInst::Lt, "<"s},  {ir::RelationInst::Gt, ">"s},
        {ir::RelationInst::Le, "<="s}, {ir::RelationInst::Ge, ">="s}};
    assert(vnStr.size() == 2);
    auto op = p->getOp();
    if (op == ir::RelationInst::Gt)
      return "<" + vnStr[1] + "," + vnStr[0];
    if (op == ir::RelationInst::Ge)
      return "<=" + vnStr[1] + "," + vnStr[0];

    if ((op == ir::RelationInst::Eq || op == ir::RelationInst::Ne) &&
        valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(op) + vnStr[0] + "," + vnStr[1];
  }
  if (auto p = ir::dyc<ir::Phi>(inst)) {
    std::string res = "phi,";
    for (auto &s : vnStr)
      res += s + ",";
    return res;
  }
  assert(false);
}